

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afmparse.c
# Opt level: O3

AFM_Token afm_tokenize(char *key,FT_Offset len)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  char **ppcVar4;
  int iVar5;
  bool bVar6;
  
  cVar1 = *key;
  ppcVar4 = afm_key_table;
  iVar5 = 1;
  do {
    if (**ppcVar4 == cVar1) {
      while( true ) {
        if (**ppcVar4 != cVar1) {
          return AFM_TOKEN_UNKNOWN;
        }
        iVar3 = strncmp(*ppcVar4,key,len);
        if (iVar3 == 0) break;
        ppcVar4 = ppcVar4 + 1;
        bVar6 = iVar5 == 0x4a;
        iVar5 = iVar5 + 1;
        if (bVar6) {
          return AFM_TOKEN_UNKNOWN;
        }
      }
      return iVar5 - AFM_TOKEN_AXISLABEL;
    }
    ppcVar4 = ppcVar4 + 1;
    uVar2 = iVar5 - 1;
    iVar5 = iVar5 + 1;
  } while (uVar2 < 0x49);
  return AFM_TOKEN_UNKNOWN;
}

Assistant:

static AFM_Token
  afm_tokenize( const char*  key,
                FT_Offset    len )
  {
    int  n;


    for ( n = 0; n < N_AFM_TOKENS; n++ )
    {
      if ( *( afm_key_table[n] ) == *key )
      {
        for ( ; n < N_AFM_TOKENS; n++ )
        {
          if ( *( afm_key_table[n] ) != *key )
            return AFM_TOKEN_UNKNOWN;

          if ( ft_strncmp( afm_key_table[n], key, len ) == 0 )
            return (AFM_Token) n;
        }
      }
    }

    return AFM_TOKEN_UNKNOWN;
  }